

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void clear(void)

{
  int local_10;
  int local_c;
  int j;
  int i;
  
  start = true;
  for (local_c = 0; local_c < bsize + 2; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < bsize + 2; local_10 = local_10 + 1) {
      if ((local_c % (bsize + 1)) * (local_10 % (bsize + 1)) == 0) {
        board[local_c][local_10] = '\x01';
      }
      else {
        board[local_c][local_10] = '\0';
      }
      points[local_c][local_10] = 0;
    }
  }
  return;
}

Assistant:

void clear() {
    start = true;
    for (int i = 0; i < bsize + 2; i++)
        for (int j = 0; j < bsize + 2; j++) {
            if ((i % (bsize + 1)) * (j % (bsize + 1)) == 0) board[i][j] = 1; else board[i][j] = 0;
            points[i][j] = 0;
        }
}